

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

bool GetOptionalBignum(FileTest *t,UniquePtr<BIGNUM> *out,string *key)

{
  bool bVar1;
  uchar *s;
  size_type sVar2;
  BIGNUM *__p;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string *key_local;
  UniquePtr<BIGNUM> *out_local;
  FileTest *t_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)key;
  bVar1 = FileTest::HasAttribute(t,key);
  if (bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    bVar1 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                               (string *)
                               bytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      s = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      __p = BN_bin2bn(s,(int)sVar2,(BIGNUM *)0x0);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::reset(out,(pointer)__p);
      t_local._7_1_ = std::operator!=(out,(nullptr_t)0x0);
    }
    else {
      t_local._7_1_ = false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  else {
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::operator=(out,(nullptr_t)0x0);
    t_local._7_1_ = true;
  }
  return t_local._7_1_;
}

Assistant:

static bool GetOptionalBignum(FileTest *t, bssl::UniquePtr<BIGNUM> *out,
                              const std::string &key) {
  if (!t->HasAttribute(key)) {
    *out = nullptr;
    return true;
  }

  std::vector<uint8_t> bytes;
  if (!t->GetBytes(&bytes, key)) {
    return false;
  }

  out->reset(BN_bin2bn(bytes.data(), bytes.size(), nullptr));
  return *out != nullptr;
}